

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  size_type *psVar1;
  tm *ptVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  tm time_struct;
  int local_254;
  tm local_250;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  ulong *local_158;
  long local_150;
  ulong local_148;
  long lStack_140;
  long *local_138;
  undefined8 local_130;
  long local_128;
  undefined8 uStack_120;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  long *local_f8;
  undefined8 local_f0;
  long local_e8;
  undefined8 uStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  long *local_b8;
  undefined8 local_b0;
  long local_a8;
  undefined8 uStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  long *local_78;
  undefined8 local_70;
  long local_68;
  undefined8 uStack_60;
  ulong *local_58;
  long local_50;
  ulong local_48;
  long lStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (ulong *)((long)this / 1000);
  ptVar2 = localtime_r((time_t *)&local_58,&local_250);
  if (ptVar2 == (tm *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    goto LAB_0014efb6;
  }
  local_254 = local_250.tm_year + 0x76c;
  StreamableToString<int>(&local_178,&local_254);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_178);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_148 = *puVar5;
    lStack_140 = plVar3[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *puVar5;
    local_158 = (ulong *)*plVar3;
  }
  local_150 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_198,(String *)(ulong)(local_250.tm_mon + 1),(int)local_150);
  uVar6 = 0xf;
  if (local_158 != &local_148) {
    uVar6 = local_148;
  }
  if (uVar6 < local_198._M_string_length + local_150) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      uVar7 = local_198.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_198._M_string_length + local_150) goto LAB_0014e897;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_158);
  }
  else {
LAB_0014e897:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_198._M_dataplus._M_p);
  }
  local_138 = &local_128;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_128 = *plVar3;
    uStack_120 = puVar4[3];
  }
  else {
    local_128 = *plVar3;
    local_138 = (long *)*puVar4;
  }
  local_130 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_138);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_108 = *puVar5;
    lStack_100 = plVar3[3];
    local_118 = &local_108;
  }
  else {
    local_108 = *puVar5;
    local_118 = (ulong *)*plVar3;
  }
  local_110 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_1b8,(String *)(ulong)(uint)local_250.tm_mday,(int)local_110);
  uVar6 = 0xf;
  if (local_118 != &local_108) {
    uVar6 = local_108;
  }
  if (uVar6 < local_1b8._M_string_length + local_110) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      uVar7 = local_1b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_1b8._M_string_length + local_110) goto LAB_0014e9db;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_118);
  }
  else {
LAB_0014e9db:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_1b8._M_dataplus._M_p);
  }
  local_f8 = &local_e8;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_e8 = *plVar3;
    uStack_e0 = puVar4[3];
  }
  else {
    local_e8 = *plVar3;
    local_f8 = (long *)*puVar4;
  }
  local_f0 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_c8 = *puVar5;
    lStack_c0 = plVar3[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar5;
    local_d8 = (ulong *)*plVar3;
  }
  local_d0 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_1d8,(String *)(ulong)(uint)local_250.tm_hour,(int)local_d0);
  uVar6 = 0xf;
  if (local_d8 != &local_c8) {
    uVar6 = local_c8;
  }
  if (uVar6 < local_1d8._M_string_length + local_d0) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      uVar7 = local_1d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_1d8._M_string_length + local_d0) goto LAB_0014eb21;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_d8);
  }
  else {
LAB_0014eb21:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_1d8._M_dataplus._M_p);
  }
  local_b8 = &local_a8;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_a8 = *plVar3;
    uStack_a0 = puVar4[3];
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*puVar4;
  }
  local_b0 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_88 = *puVar5;
    lStack_80 = plVar3[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *puVar5;
    local_98 = (ulong *)*plVar3;
  }
  local_90 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_1f8,(String *)(ulong)(uint)local_250.tm_min,(int)local_90);
  uVar6 = 0xf;
  if (local_98 != &local_88) {
    uVar6 = local_88;
  }
  if (uVar6 < local_1f8._M_string_length + local_90) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      uVar7 = local_1f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_1f8._M_string_length + local_90) goto LAB_0014ec57;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,(ulong)local_98);
  }
  else {
LAB_0014ec57:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_1f8._M_dataplus._M_p);
  }
  local_78 = &local_68;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_68 = *plVar3;
    uStack_60 = puVar4[3];
  }
  else {
    local_68 = *plVar3;
    local_78 = (long *)*puVar4;
  }
  local_70 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_48 = *puVar5;
    lStack_40 = plVar3[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *puVar5;
    local_58 = (ulong *)*plVar3;
  }
  local_50 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_218,(String *)(ulong)(uint)local_250.tm_sec,(int)local_50);
  uVar6 = 0xf;
  if (local_58 != &local_48) {
    uVar6 = local_48;
  }
  if (uVar6 < local_218._M_string_length + local_50) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      uVar7 = local_218.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_218._M_string_length + local_50) goto LAB_0014ed89;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_58);
  }
  else {
LAB_0014ed89:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_218._M_dataplus._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar7 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
LAB_0014efb6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct.tm_mday) + "T" +
      String::FormatIntWidth2(time_struct.tm_hour) + ":" +
      String::FormatIntWidth2(time_struct.tm_min) + ":" +
      String::FormatIntWidth2(time_struct.tm_sec);
}